

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

void mbedtls_gcm_free(mbedtls_gcm_context *ctx)

{
  size_t in_RDI;
  
  if (in_RDI != 0) {
    mbedtls_cipher_free((mbedtls_cipher_context_t *)0x8621f7);
    mbedtls_platform_zeroize(ctx,in_RDI);
  }
  return;
}

Assistant:

void mbedtls_gcm_free(mbedtls_gcm_context *ctx)
{
    if (ctx == NULL) {
        return;
    }
#if defined(MBEDTLS_BLOCK_CIPHER_C)
    mbedtls_block_cipher_free(&ctx->block_cipher_ctx);
#else
    mbedtls_cipher_free(&ctx->cipher_ctx);
#endif
    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_gcm_context));
}